

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O2

void __thiscall re2c::GoBitmap::emit(GoBitmap *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  uint32_t n;
  OutputFile *pOVar1;
  opt_t *poVar2;
  undefined4 in_register_00000014;
  SwitchIf *in_R9;
  string yych;
  string sStack_48;
  
  output_hgo_abi_cxx11_
            (&sStack_48,(re2c *)o,(OutputFile *)CONCAT44(in_register_00000014,ind),(uint32_t)readCh,
             (bool *)this->hgo,in_R9);
  pOVar1 = OutputFile::ws(o,"if (");
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  pOVar1 = OutputFile::wstring(pOVar1,&poVar2->yybm);
  pOVar1 = OutputFile::ws(pOVar1,"[");
  pOVar1 = OutputFile::wu32(pOVar1,this->bitmap->i);
  pOVar1 = OutputFile::ws(pOVar1,"+");
  pOVar1 = OutputFile::wstring(pOVar1,&sStack_48);
  OutputFile::ws(pOVar1,"] & ");
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  n = this->bitmap->m;
  if (poVar2->yybmHexTable == true) {
    OutputFile::wu32_hex(o,n);
  }
  else {
    OutputFile::wu32(o,n);
  }
  OutputFile::ws(o,") {\n");
  output_goto(o,ind + 1,readCh,(label_t)(this->bitmap_state->label).value);
  pOVar1 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar1,"}\n");
  if (this->lgo != (SwitchIf *)0x0) {
    SwitchIf::emit(this->lgo,o,ind,readCh);
  }
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void GoBitmap::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	std::string yych = output_hgo (o, ind, readCh, hgo);
	o.ws("if (").wstring(opts->yybm).ws("[").wu32(bitmap->i).ws("+").wstring(yych).ws("] & ");
	if (opts->yybmHexTable)
	{
		o.wu32_hex(bitmap->m);
	}
	else
	{
		o.wu32(bitmap->m);
	}
	o.ws(") {\n");
	output_goto (o, ind + 1, readCh, bitmap_state->label);
	o.wind(ind).ws("}\n");
	if (lgo != NULL)
	{
		lgo->emit (o, ind, readCh);
	}
}